

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::udivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  uint numBits;
  ulong uVar1;
  ulong uVar2;
  APInt *this;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint64_t val;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  APInt *local_38;
  
  numBits = LHS->BitWidth;
  if (numBits != RHS->BitWidth) {
    __assert_fail("LHS.BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6b5,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  if (numBits < 0x41) {
    uVar1 = (RHS->U).VAL;
    if (uVar1 == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6ba,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    uVar2 = (LHS->U).VAL;
    APInt((APInt *)&local_48,numBits,uVar2 / uVar1,false);
    operator=(Quotient,(APInt *)&local_48);
    if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
      operator_delete__(local_48.pVal);
    }
    APInt((APInt *)&local_48,numBits,uVar2 % uVar1,false);
    operator=(Remainder,(APInt *)&local_48);
    goto joined_r0x00170ef5;
  }
  uVar4 = countLeadingZerosSlowCase(LHS);
  uVar5 = countLeadingZerosSlowCase(RHS);
  if (numBits == uVar5) {
    __assert_fail("rhsWords && \"Performing divrem operation by zero ???\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6c6,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  local_38 = Quotient;
  if (numBits == uVar4) {
    val = 0;
LAB_00170de5:
    APInt((APInt *)&local_48,numBits,val,false);
    operator=(local_38,(APInt *)&local_48);
    if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
      operator_delete__(local_48.pVal);
    }
    APInt((APInt *)&local_48,numBits,0,false);
  }
  else {
    if (numBits - uVar5 == 1) {
      operator=(Quotient,LHS);
      APInt((APInt *)&local_48,numBits,0,false);
      operator=(Remainder,(APInt *)&local_48);
      if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
        operator_delete__(local_48.pVal);
      }
    }
    uVar4 = (uint)((ulong)(numBits - uVar4) + 0x3f >> 6);
    uVar5 = (uint)((ulong)(numBits - uVar5) + 0x3f >> 6);
    if ((uVar5 <= uVar4) && (iVar6 = compare(LHS,RHS), -1 < iVar6)) {
      bVar3 = operator==(LHS,RHS);
      this = local_38;
      if (!bVar3) {
        reallocate(local_38,numBits);
        reallocate(Remainder,numBits);
        if (uVar4 == 1) {
          uVar1 = *(LHS->U).pVal;
          uVar2 = *(RHS->U).pVal;
          operator=(this,uVar1 / uVar2);
          operator=(Remainder,uVar1 % uVar2);
          return;
        }
        divide((LHS->U).pVal,uVar4,(RHS->U).pVal,uVar5,(this->U).pVal,(Remainder->U).pVal);
        iVar6 = (int)((ulong)numBits + 0x3f >> 6);
        memset((void *)((ulong)(uVar4 * 8) + (long)(this->U).pVal),0,(ulong)((iVar6 - uVar4) * 8));
        memset((void *)((ulong)(uVar5 * 8) + (long)(Remainder->U).pVal),0,
               (ulong)((iVar6 - uVar5) * 8));
        return;
      }
      val = 1;
      goto LAB_00170de5;
    }
    operator=(Remainder,LHS);
    APInt((APInt *)&local_48,numBits,0,false);
    Remainder = local_38;
  }
  operator=(Remainder,(APInt *)&local_48);
joined_r0x00170ef5:
  if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  assert(LHS.BitWidth == RHS.BitWidth && "Bit widths must be the same");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    uint64_t QuotVal = LHS.U.VAL / RHS.U.VAL;
    uint64_t RemVal = LHS.U.VAL % RHS.U.VAL;
    Quotient = APInt(BitWidth, QuotVal);
    Remainder = APInt(BitWidth, RemVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing divrem operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = APInt(BitWidth, 0);   // 0 % Y ===> 0
    return;
  }

  if (rhsBits == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = APInt(BitWidth, 0);   // X % 1 ===> 0
  }

  if (lhsWords < rhsWords || LHS.ult(RHS)) {
    Remainder = LHS;                  // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = APInt(BitWidth, 0);   // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient or Remainder is aliased
  // with LHS or RHS.
  Quotient.reallocate(BitWidth);
  Remainder.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    uint64_t rhsValue = RHS.U.pVal[0];
    Quotient = lhsValue / rhsValue;
    Remainder = lhsValue % rhsValue;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal,
         Remainder.U.pVal);
  // Clear the rest of the Quotient and Remainder.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
  std::memset(Remainder.U.pVal + rhsWords, 0,
              (getNumWords(BitWidth) - rhsWords) * APINT_WORD_SIZE);
}